

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *pCVar1;
  bool bVar2;
  ChunkHeader *next;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  while( true ) {
    bVar2 = false;
    if (this->chunkHead_ != (ChunkHeader *)0x0) {
      bVar2 = this->chunkHead_ != (ChunkHeader *)this->userBuffer_;
    }
    if (!bVar2) break;
    pCVar1 = this->chunkHead_->next;
    CrtAllocator::Free(this->chunkHead_);
    this->chunkHead_ = pCVar1;
  }
  if ((this->chunkHead_ != (ChunkHeader *)0x0) &&
     (this->chunkHead_ == (ChunkHeader *)this->userBuffer_)) {
    this->chunkHead_->size = 0;
  }
  return;
}

Assistant:

void Clear() {
        while (chunkHead_ && chunkHead_ != userBuffer_) {
            ChunkHeader* next = chunkHead_->next;
            baseAllocator_->Free(chunkHead_);
            chunkHead_ = next;
        }
        if (chunkHead_ && chunkHead_ == userBuffer_)
            chunkHead_->size = 0; // Clear user buffer
    }